

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

VoidPromiseAndPipeline * __thiscall
capnp::LocalClient::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,LocalClient *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  Promise<void> PVar2;
  Promise<void> completionPromise;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>,_void>
  pipelinePromise;
  ForkedPromise<void> forked;
  Promise<void> promise;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:490:59),_capnp::AnyPointer::Pipeline>
  tailPipelinePromise;
  undefined1 local_98 [8];
  Disposer *pDStack_90;
  undefined1 local_88 [8];
  QueuedPipeline *pQStack_80;
  Own<capnp::LocalClient> local_70;
  Own<kj::_::ForkHub<kj::_::Void>_> local_60;
  Own<kj::_::PromiseNode> local_50;
  undefined1 local_40 [16];
  uint16_t uStack_30;
  undefined6 uStack_2e;
  undefined8 local_28;
  
  local_28 = context->ptr;
  uStack_30 = methodId;
  local_40._0_8_ = this;
  local_40._8_8_ = interfaceId;
  kj::
  evalLater<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda()_1_>
            ((kj *)&local_60,(anon_class_32_4_d5fa3d7c_for_func *)local_40);
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_70.disposer = &(this->super_Refcounted).super_Disposer;
  local_70.ptr = this;
  kj::Promise<void>::attach<kj::Own<capnp::LocalClient>>
            ((Promise<void> *)&local_50,(Own<capnp::LocalClient> *)&local_60);
  kj::Own<capnp::LocalClient>::dispose(&local_70);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_60);
  kj::Promise<void>::fork((Promise<void> *)&local_60);
  PVar2 = kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_98);
  (*context->ptr->_vptr_CallContextHook[7])(local_88,context->ptr,PVar2.super_PromiseBase.node.ptr);
  local_40._8_8_ = local_88;
  _uStack_30 = pQStack_80;
  pQStack_80 = (QueuedPipeline *)0x0;
  kj::Promise<void>::
  then<kj::CaptureByMove<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>
            ((Promise<void> *)&local_70,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>
              *)local_98,(PropagateException *)local_40);
  kj::Own<capnp::CallContextHook>::dispose((Own<capnp::CallContextHook> *)(local_40 + 8));
  kj::Own<capnp::CallContextHook>::dispose((Own<capnp::CallContextHook> *)local_88);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_98);
  (*context->ptr->_vptr_CallContextHook[5])(local_98);
  kj::Promise<capnp::AnyPointer::Pipeline>::
  then<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(capnp::AnyPointer::Pipeline&&)_1_,kj::_::PropagateException>
            ((Promise<capnp::AnyPointer::Pipeline> *)local_40,
             (anon_class_1_0_00000001_for_func *)local_98,(PropagateException *)local_88);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_98);
  kj::Promise<kj::Own<capnp::PipelineHook>_>::exclusiveJoin
            ((Promise<kj::Own<capnp::PipelineHook>_> *)local_98,
             (Promise<kj::Own<capnp::PipelineHook>_> *)&local_70);
  kj::Own<kj::_::PromiseNode>::operator=
            ((Own<kj::_::PromiseNode> *)&local_70,(Own<kj::_::PromiseNode> *)local_98);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_98);
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_88);
  kj::Promise<void>::attach<kj::Own<capnp::CallContextHook>>
            ((Promise<void> *)local_98,(Own<capnp::CallContextHook> *)local_88);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_88);
  (__return_storage_ptr__->promise).super_PromiseBase.node.disposer = (Disposer *)local_98;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = (PromiseNode *)pDStack_90;
  pDStack_90 = (Disposer *)0x0;
  kj::refcounted<capnp::QueuedPipeline,kj::Promise<kj::Own<capnp::PipelineHook>>>
            ((kj *)local_88,(Promise<kj::Own<capnp::PipelineHook>_> *)&local_70);
  (__return_storage_ptr__->pipeline).disposer = (Disposer *)local_88;
  (__return_storage_ptr__->pipeline).ptr = &pQStack_80->super_PipelineHook;
  pQStack_80 = (QueuedPipeline *)0x0;
  kj::Own<capnp::QueuedPipeline>::dispose((Own<capnp::QueuedPipeline> *)local_88);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_98);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_40);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_70);
  kj::Own<kj::_::ForkHub<kj::_::Void>_>::dispose(&local_60);
  kj::Own<kj::_::PromiseNode>::dispose(&local_50);
  return __return_storage_ptr__;
}

Assistant:

VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context) override {
    auto contextPtr = context.get();

    // We don't want to actually dispatch the call synchronously, because we don't want the callee
    // to have any side effects before the promise is returned to the caller.  This helps avoid
    // race conditions.
    //
    // So, we do an evalLater() here.
    //
    // Note also that QueuedClient depends on this evalLater() to ensure that pipelined calls don't
    // complete before 'whenMoreResolved()' promises resolve.
    auto promise = kj::evalLater([this,interfaceId,methodId,contextPtr]() {
      return server->dispatchCall(interfaceId, methodId,
                                  CallContext<AnyPointer, AnyPointer>(*contextPtr));
    }).attach(kj::addRef(*this));

    // We have to fork this promise for the pipeline to receive a copy of the answer.
    auto forked = promise.fork();

    auto pipelinePromise = forked.addBranch().then(kj::mvCapture(context->addRef(),
        [=](kj::Own<CallContextHook>&& context) -> kj::Own<PipelineHook> {
          context->releaseParams();
          return kj::refcounted<LocalPipeline>(kj::mv(context));
        }));

    auto tailPipelinePromise = context->onTailCall().then([](AnyPointer::Pipeline&& pipeline) {
      return kj::mv(pipeline.hook);
    });

    pipelinePromise = pipelinePromise.exclusiveJoin(kj::mv(tailPipelinePromise));

    auto completionPromise = forked.addBranch().attach(kj::mv(context));

    return VoidPromiseAndPipeline { kj::mv(completionPromise),
        kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise)) };
  }